

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLevel1DLookupResultValid
               (ConstPixelBufferAccess *access,Sampler *sampler,TexLookupScaleMode scaleMode,
               IntLookupPrecision *prec,float coordX,int coordY,IVec4 *result)

{
  ulong uVar1;
  long lVar2;
  int y;
  ulong uVar3;
  int i;
  int c;
  float fVar4;
  uint uVar5;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar6 [16];
  Vector<bool,_4> res;
  Vector<int,_4> color;
  Vec2 uBounds;
  undefined4 local_54;
  IVec4 *local_50;
  TextureFormat local_48;
  int iStack_40;
  int iStack_3c;
  float local_38;
  float local_34;
  
  local_50 = result;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(access->m_size).m_data[0],
             coordX,*(int *)prec,*(int *)(prec + 0xc));
  fVar4 = floorf(local_38);
  c = (int)fVar4;
  fVar4 = floorf(local_34);
  do {
    if ((int)fVar4 < c) {
      return false;
    }
    y = TexVerifierUtil::wrap(sampler->wrapS,c,(access->m_size).m_data[0]);
    if ((((y < 0) || ((access->m_size).m_data[0] <= y)) || (coordY < 0)) ||
       (((access->m_size).m_data[1] <= coordY || ((access->m_size).m_data[2] < 1)))) {
      sampleTextureBorder<int>(&local_48,(Sampler *)access);
    }
    else {
      ConstPixelBufferAccess::getPixelT<int>
                ((ConstPixelBufferAccess *)&local_48,(int)access,y,coordY);
    }
    uVar5 = -(uint)(local_50->m_data[0] < (int)local_48.order);
    uVar7 = -(uint)(local_50->m_data[1] < (int)local_48.type);
    uVar8 = -(uint)(local_50->m_data[2] < iStack_40);
    uVar9 = -(uint)(local_50->m_data[3] < iStack_3c);
    auVar6._0_4_ = -(uint)((int)(*(uint *)(prec + 0x18) ^ 0x80000000) <
                          (int)(uVar5 - (local_48.order - local_50->m_data[0] ^ uVar5) ^ 0x80000000)
                          );
    auVar6._4_4_ = -(uint)((int)(*(uint *)(prec + 0x1c) ^ 0x80000000) <
                          (int)(uVar7 - (local_48.type - local_50->m_data[1] ^ uVar7) ^ 0x80000000))
    ;
    auVar6._8_4_ = -(uint)((int)(*(uint *)(prec + 0x20) ^ 0x80000000) <
                          (int)(uVar8 - (iStack_40 - local_50->m_data[2] ^ uVar8) ^ 0x80000000));
    auVar6._12_4_ =
         -(uint)((int)(*(uint *)(prec + 0x24) ^ 0x80000000) <
                (int)(uVar9 - (iStack_3c - local_50->m_data[3] ^ uVar9) ^ 0x80000000));
    auVar6 = packssdw(auVar6,auVar6);
    auVar6 = packsswb(auVar6 ^ _DAT_00aef830,auVar6 ^ _DAT_00aef830);
    local_54 = *(uint *)(prec + 0x28) ^ 0x1010101 | auVar6._0_4_ & 0x1010101;
    if ((char)local_54 != '\0') {
      uVar3 = 0xffffffffffffffff;
      do {
        if (uVar3 == 2) {
          return true;
        }
        uVar1 = uVar3 + 1;
        lVar2 = uVar3 + 2;
        uVar3 = uVar1;
      } while (*(char *)((long)&local_54 + lVar2) != '\0');
      if (2 < uVar1) {
        return true;
      }
    }
    c = c + 1;
  } while( true );
}

Assistant:

bool isLevel1DLookupResultValid (const ConstPixelBufferAccess&	access,
								 const Sampler&					sampler,
								 TexLookupScaleMode				scaleMode,
								 const IntLookupPrecision&		prec,
								 const float					coordX,
								 const int						coordY,
								 const IVec4&					result)
{
	DE_ASSERT(sampler.minFilter == Sampler::NEAREST && sampler.magFilter == Sampler::NEAREST);
	DE_UNREF(scaleMode);
	return isNearestSampleResultValid(access, sampler, prec, coordX, coordY, result);
}